

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utlru_cache.hpp
# Opt level: O3

void __thiscall
cappuccino::
utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::do_insert(utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
            *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
           basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,time_point now,
           time_point expire_time)

{
  size_t *psVar1;
  pointer peVar2;
  _List_node_base *p_Var3;
  time_point __offout;
  size_t in_R9;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>,_bool>
  pVar4;
  unsigned_long element_idx;
  _List_node_base *p_Var5;
  
  __offout.__d.__r = expire_time.__d.__r;
  if ((ulong)((long)(this->m_elements).
                    super__Vector_base<cappuccino::utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_elements).
                    super__Vector_base<cappuccino::utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 6) <= this->m_used_size) {
    do_prune(this,now);
  }
  p_Var5 = (this->m_lru_end)._M_node[1]._M_next;
  pVar4 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::__cxx11::string_const&,unsigned_long&>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&this->m_keyed_elements,key,&stack0xffffffffffffffc8);
  p_Var3 = (_List_node_base *)operator_new(0x18);
  p_Var3[1]._M_next = p_Var5;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar1 = &(this->m_ttl_list).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  peVar2 = (this->m_elements).
           super__Vector_base<cappuccino::utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
           ._M_impl.super__Vector_impl_data._M_start + (long)p_Var5;
  std::__cxx11::string::operator=((string *)&peVar2->m_value,(string *)value);
  (peVar2->m_expire_time).__d.__r = (rep)expire_time.__d.__r;
  (peVar2->m_lru_position)._M_node = (this->m_lru_end)._M_node;
  (peVar2->m_ttl_position)._M_node =
       (this->m_ttl_list).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       _M_node.super__List_node_base._M_prev;
  (peVar2->m_keyed_position).
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  ._M_cur = (__node_type *)
            pVar4.first.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
            ._M_cur.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  ;
  p_Var3 = (this->m_lru_list).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  (this->m_lru_end)._M_node = ((this->m_lru_end)._M_node)->_M_next;
  this->m_used_size = this->m_used_size + 1;
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::splice
            (&this->m_lru_list,(int)p_Var3,(__off64_t *)&this->m_lru_list,
             (int)(peVar2->m_lru_position)._M_node,(__off64_t *)__offout.__d.__r,in_R9,(uint)p_Var5)
  ;
  return;
}

Assistant:

auto do_insert(
        const key_type&                       key,
        value_type&&                          value,
        std::chrono::steady_clock::time_point now,
        std::chrono::steady_clock::time_point expire_time) -> void
    {
        if (m_used_size >= m_elements.size())
        {
            do_prune(now);
        }
        auto element_idx = *m_lru_end;

        auto keyed_position = m_keyed_elements.emplace(key, element_idx).first;

        m_ttl_list.emplace_back(element_idx);

        element& e         = m_elements[element_idx];
        e.m_value          = std::move(value);
        e.m_expire_time    = expire_time;
        e.m_lru_position   = m_lru_end;
        e.m_ttl_position   = std::prev(m_ttl_list.end());
        e.m_keyed_position = keyed_position;

        ++m_lru_end;

        ++m_used_size;

        do_access(e);
    }